

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_net.cpp
# Opt level: O3

int libtorrent::aux::anon_unknown_4::nl_dump_request
              (int sock,uint32_t seq,nlmsghdr *request_msg,function<void_(const_nlmsghdr_*)> *on_msg
              )

{
  _Manager_type p_Var1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  ulong uVar5;
  nlmsghdr *pnVar6;
  uint uVar7;
  ulong uVar8;
  socklen_t sock_addr_len;
  sockaddr_nl sock_addr;
  _Any_data local_1068;
  _Manager_type local_1058;
  _Invoker_type local_1050;
  nlmsghdr *local_1048;
  socklen_t local_1040;
  undefined1 local_103c [4108];
  
  request_msg->nlmsg_flags = 0x301;
  request_msg->nlmsg_seq = seq;
  request_msg->nlmsg_pid = 0;
  sVar4 = send(sock,request_msg,(ulong)request_msg->nlmsg_len,0);
  if (-1 < sVar4) {
    local_1040 = 0xc;
    iVar2 = getsockname(sock,(sockaddr *)local_103c,&local_1040);
    if (-1 < iVar2) {
      local_1068._M_unused._M_object = (void *)0x0;
      local_1068._8_8_ = 0;
      local_1058 = (_Manager_type)0x0;
      local_1050 = on_msg->_M_invoker;
      p_Var1 = (on_msg->super__Function_base)._M_manager;
      if (p_Var1 != (_Manager_type)0x0) {
        local_1068._M_unused._0_8_ =
             (undefined8)*(undefined8 *)&(on_msg->super__Function_base)._M_functor;
        local_1068._8_8_ = *(undefined8 *)((long)&(on_msg->super__Function_base)._M_functor + 8);
        (on_msg->super__Function_base)._M_manager = (_Manager_type)0x0;
        on_msg->_M_invoker = (_Invoker_type)0x0;
        local_1058 = p_Var1;
      }
      uVar5 = recv(sock,local_103c + 0xc,0x1000,0);
      if (-1 < (int)uVar5) {
        do {
          if (0xf < (uint)uVar5) {
            pnVar6 = (nlmsghdr *)(local_103c + 0xc);
            uVar8 = uVar5 & 0xffffffff;
            do {
              uVar3 = pnVar6->nlmsg_len;
              if ((uVar3 < 0x10) || ((uint)uVar8 < uVar3)) break;
              if (((uint)uVar5 < uVar3) ||
                 (((pnVar6->nlmsg_type == 2 || (pnVar6->nlmsg_seq != seq)) ||
                  (pnVar6->nlmsg_pid != local_103c._4_4_)))) goto LAB_001b2cb3;
              iVar2 = 0;
              if (pnVar6->nlmsg_type == 3) goto LAB_001b2cb9;
              local_1048 = pnVar6;
              if (local_1058 == (_Manager_type)0x0) {
                ::std::__throw_bad_function_call();
              }
              (*local_1050)(&local_1068,&local_1048);
              iVar2 = 0;
              if ((pnVar6->nlmsg_flags & 2) == 0) goto LAB_001b2cb9;
              uVar3 = pnVar6->nlmsg_len + 3 & 0xfffffffc;
              uVar7 = (uint)uVar8 - uVar3;
              uVar8 = (ulong)uVar7;
              pnVar6 = (nlmsghdr *)((long)&pnVar6->nlmsg_len + (ulong)uVar3);
            } while (0xf < (int)uVar7);
          }
          uVar5 = recv(sock,local_103c + 0xc,0x1000,0);
        } while (-1 < (int)uVar5);
      }
LAB_001b2cb3:
      iVar2 = -1;
LAB_001b2cb9:
      if (local_1058 == (_Manager_type)0x0) {
        return iVar2;
      }
      (*local_1058)(&local_1068,&local_1068,__destroy_functor);
      return iVar2;
    }
  }
  return -1;
}

Assistant:

int nl_dump_request(int const sock, std::uint32_t const seq
		, nlmsghdr* const request_msg, std::function<void(nlmsghdr const*)> on_msg)
	{
		request_msg->nlmsg_flags = NLM_F_DUMP | NLM_F_REQUEST;
		request_msg->nlmsg_seq = seq;
		// in theory nlmsg_pid should be set to the netlink port ID (NOT the process ID)
		// of the sender, but the kernel ignores this field so it is typically set to
		// zero
		request_msg->nlmsg_pid = 0;

		if (::send(sock, request_msg, request_msg->nlmsg_len, 0) < 0)
			return -1;

		// get the socket's port ID so that we can verify it in the response
		sockaddr_nl sock_addr;
		socklen_t sock_addr_len = sizeof(sock_addr);
		if (::getsockname(sock, reinterpret_cast<sockaddr*>(&sock_addr), &sock_addr_len) < 0)
			return -1;

		return read_nl_sock(sock, seq, sock_addr.nl_pid, std::move(on_msg));
	}